

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest::BasicAuthIntegrationTest
          (BasicAuthIntegrationTest *this)

{
  testing::Test::Test((Test *)this);
  (this->super_IntegrationTest).exposer_._M_t.
  super___uniq_ptr_impl<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>._M_t.
  super__Tuple_impl<0UL,_prometheus::Exposer_*,_std::default_delete<prometheus::Exposer>_>.
  super__Head_base<0UL,_prometheus::Exposer_*,_false>._M_head_impl = (Exposer *)0x0;
  (this->super_IntegrationTest).fetchPrePerform_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->super_IntegrationTest).fetchPrePerform_._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->super_IntegrationTest).fetchPrePerform_.super__Function_base._M_functor = 0
  ;
  *(undefined8 *)
   ((long)&(this->super_IntegrationTest).fetchPrePerform_.super__Function_base._M_functor + 8) = 0;
  (this->super_IntegrationTest).base_url_._M_dataplus._M_p =
       (pointer)&(this->super_IntegrationTest).base_url_.field_2;
  (this->super_IntegrationTest).base_url_._M_string_length = 0;
  (this->super_IntegrationTest).base_url_.field_2._M_local_buf[0] = '\0';
  (this->super_IntegrationTest).default_metrics_path_._M_dataplus._M_p =
       (pointer)&(this->super_IntegrationTest).default_metrics_path_.field_2;
  (this->super_IntegrationTest).default_metrics_path_.field_2._M_allocated_capacity =
       0x7363697274656d2f;
  (this->super_IntegrationTest).default_metrics_path_._M_string_length = 8;
  (this->super_IntegrationTest).default_metrics_path_.field_2._M_local_buf[8] = '\0';
  (this->super_IntegrationTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BasicAuthIntegrationTest_0018f260;
  (this->counter_name_)._M_dataplus._M_p = (pointer)&(this->counter_name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->counter_name_,"example_total","")
  ;
  (this->username_)._M_dataplus._M_p = (pointer)&(this->username_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->username_,"test_user","");
  (this->password_)._M_dataplus._M_p = (pointer)&(this->password_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->password_,"test_password","");
  (this->registry_).super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->registry_).super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

void SetUp() override {
    IntegrationTest::SetUp();

    registry_ = RegisterSomeCounter(counter_name_, default_metrics_path_);

    exposer_->RegisterAuth(
        [&](const std::string& user, const std::string& password) {
          return user == username_ && password == password_;
        },
        "Some Auth Realm", default_metrics_path_);
  }